

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::CollationDataBuilder::copyFrom
          (CollationDataBuilder *this,CollationDataBuilder *src,CEModifier *modifier,
          UErrorCode *errorCode)

{
  UBool UVar1;
  CopyHelper helper;
  CollationDataBuilder *local_140;
  CollationDataBuilder *local_138;
  CEModifier *local_130;
  UErrorCode local_30;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if ((this->trie != (UTrie2 *)0x0) && (UVar1 = utrie2_isFrozen_63(this->trie), UVar1 == '\0')) {
    local_30 = *errorCode;
    local_140 = src;
    local_138 = this;
    local_130 = modifier;
    utrie2_enum_63(src->trie,(UTrie2EnumValue *)0x0,enumRangeForCopy,&local_140);
    *errorCode = local_30;
    this->modified = this->modified | src->modified;
    return;
  }
  *errorCode = U_INVALID_STATE_ERROR;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }